

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::FoldConditionBlock
          (LoopUnrollerUtilsImpl *this,BasicBlock *condition_block,uint32_t operand_label)

{
  IRContext *context;
  bool bVar1;
  Analysis preserved_analyses;
  Instruction *pIVar2;
  DebugScope *pDVar3;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__x;
  const_reference inst;
  Instruction *new_branch;
  InstructionBuilder builder;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> lines;
  DebugScope scope;
  uint32_t new_target;
  Instruction *old_branch;
  uint32_t operand_label_local;
  BasicBlock *condition_block_local;
  LoopUnrollerUtilsImpl *this_local;
  
  BasicBlock::tail((BasicBlock *)&scope.inlined_at_);
  pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*
                     ((iterator_template<spvtools::opt::Instruction> *)&scope.inlined_at_);
  scope.lexical_scope_ = Instruction::GetSingleWordOperand(pIVar2,operand_label);
  pDVar3 = Instruction::GetDebugScope(pIVar2);
  unique0x00012000 = *pDVar3;
  __x = Instruction::dbg_line_insts(pIVar2);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
            ((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
             &builder.preserved_analyses_,__x);
  IRContext::KillInst(this->context_,pIVar2);
  context = this->context_;
  preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&new_branch,context,condition_block,preserved_analyses);
  pIVar2 = InstructionBuilder::AddBranch((InstructionBuilder *)&new_branch,scope.lexical_scope_);
  bVar1 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
          empty((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
                &builder.preserved_analyses_);
  if (!bVar1) {
    inst = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
           back((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
                &builder.preserved_analyses_);
    Instruction::AddDebugLine(pIVar2,inst);
  }
  Instruction::SetDebugScope
            (pIVar2,(DebugScope *)
                    ((long)&lines.
                            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::~vector
            ((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
             &builder.preserved_analyses_);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::FoldConditionBlock(BasicBlock* condition_block,
                                               uint32_t operand_label) {
  // Remove the old conditional branch to the merge and continue blocks.
  Instruction& old_branch = *condition_block->tail();
  uint32_t new_target = old_branch.GetSingleWordOperand(operand_label);

  DebugScope scope = old_branch.GetDebugScope();
  const std::vector<Instruction> lines = old_branch.dbg_line_insts();

  context_->KillInst(&old_branch);
  // Add the new unconditional branch to the merge block.
  InstructionBuilder builder(
      context_, condition_block,
      IRContext::Analysis::kAnalysisDefUse |
          IRContext::Analysis::kAnalysisInstrToBlockMapping);
  Instruction* new_branch = builder.AddBranch(new_target);

  if (!lines.empty()) new_branch->AddDebugLine(&lines.back());
  new_branch->SetDebugScope(scope);
}